

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_relation.cpp
# Opt level: O1

unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> __thiscall
duckdb::TableRelation::GetTableRef(TableRelation *this)

{
  tuple<duckdb::BaseTableRef_*,_std::default_delete<duckdb::BaseTableRef>_> this_00;
  pointer pBVar1;
  long in_RSI;
  unique_ptr<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>,_true> *this_01
  ;
  templated_unique_single_t table_ref;
  __uniq_ptr_impl<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>_> local_20;
  
  this_00.super__Tuple_impl<0UL,_duckdb::BaseTableRef_*,_std::default_delete<duckdb::BaseTableRef>_>
  .super__Head_base<0UL,_duckdb::BaseTableRef_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_duckdb::BaseTableRef_*,_std::default_delete<duckdb::BaseTableRef>_>)
       operator_new(0xd0);
  BaseTableRef::BaseTableRef
            ((BaseTableRef *)
             this_00.
             super__Tuple_impl<0UL,_duckdb::BaseTableRef_*,_std::default_delete<duckdb::BaseTableRef>_>
             .super__Head_base<0UL,_duckdb::BaseTableRef_*,_false>._M_head_impl);
  this_01 = (unique_ptr<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>,_true>
             *)(in_RSI + 0x68);
  local_20._M_t.
  super__Tuple_impl<0UL,_duckdb::BaseTableRef_*,_std::default_delete<duckdb::BaseTableRef>_>.
  super__Head_base<0UL,_duckdb::BaseTableRef_*,_false>._M_head_impl =
       (tuple<duckdb::BaseTableRef_*,_std::default_delete<duckdb::BaseTableRef>_>)
       (tuple<duckdb::BaseTableRef_*,_std::default_delete<duckdb::BaseTableRef>_>)
       this_00.
       super__Tuple_impl<0UL,_duckdb::BaseTableRef_*,_std::default_delete<duckdb::BaseTableRef>_>.
       super__Head_base<0UL,_duckdb::BaseTableRef_*,_false>._M_head_impl;
  unique_ptr<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>,_true>::
  operator->(this_01);
  pBVar1 = unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>::
           operator->((unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>
                       *)&local_20);
  ::std::__cxx11::string::_M_assign((string *)&pBVar1->schema_name);
  unique_ptr<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>,_true>::
  operator->(this_01);
  pBVar1 = unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>::
           operator->((unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>
                       *)&local_20);
  ::std::__cxx11::string::_M_assign((string *)&pBVar1->table_name);
  unique_ptr<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>,_true>::
  operator->(this_01);
  pBVar1 = unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>::
           operator->((unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>
                       *)&local_20);
  ::std::__cxx11::string::_M_assign((string *)&pBVar1->catalog_name);
  (this->super_Relation)._vptr_Relation =
       (_func_int **)
       local_20._M_t.
       super__Tuple_impl<0UL,_duckdb::BaseTableRef_*,_std::default_delete<duckdb::BaseTableRef>_>.
       super__Head_base<0UL,_duckdb::BaseTableRef_*,_false>._M_head_impl;
  return (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)
         (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)this;
}

Assistant:

unique_ptr<TableRef> TableRelation::GetTableRef() {
	auto table_ref = make_uniq<BaseTableRef>();
	table_ref->schema_name = description->schema;
	table_ref->table_name = description->table;
	table_ref->catalog_name = description->database;
	return std::move(table_ref);
}